

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O3

int main(void)

{
  undefined8 ******ppppppuVar1;
  undefined8 ******ppppppuVar2;
  bool bVar3;
  in_addr_t iVar4;
  int iVar5;
  RTPPacket *p;
  int iVar6;
  ulong uVar7;
  uint16_t destport;
  uint16_t portbase;
  int num;
  string ipstr;
  timespec req;
  MyMemoryManager mgr;
  timespec rem;
  RTPIPv4Address addr;
  RTPSessionParams sessparams;
  RTPSession sess;
  short sStack_10960;
  int iStack_1095c;
  char *pcStack_10958;
  undefined8 uStack_10950;
  char cStack_10948;
  undefined7 uStack_10947;
  timespec tStack_10938;
  MyMemoryManager MStack_10928;
  RTPTransmissionParams RStack_10918;
  undefined8 uStack_10908;
  undefined8 *****pppppuStack_10900;
  undefined8 *****pppppuStack_108f8;
  undefined8 uStack_108f0;
  undefined1 uStack_108e8;
  undefined8 uStack_108e4;
  undefined8 uStack_108dc;
  undefined5 uStack_108d4;
  undefined3 uStack_108cf;
  undefined5 uStack_108cc;
  undefined8 uStack_108c0;
  timespec tStack_108b8;
  RTPAddress RStack_108a8;
  short sStack_10896;
  RTPSessionParams RStack_10890;
  RTPSession RStack_107e8;
  
  MStack_10928.super_RTPMemoryManager._vptr_RTPMemoryManager =
       (_func_int **)&PTR__MyMemoryManager_0013afe0;
  MStack_10928.alloccount = 0;
  MStack_10928.freecount = 0;
  jrtplib::RTPSession::RTPSession
            (&RStack_107e8,(RTPRandom *)0x0,&MStack_10928.super_RTPMemoryManager);
  pcStack_10958 = &cStack_10948;
  uStack_10950 = 0;
  cStack_10948 = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter local portbase:",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter the destination IP address",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&pcStack_10958);
  iVar4 = inet_addr(pcStack_10958);
  if (iVar4 == 0xffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Bad IP address specified",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    iVar5 = -1;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter the destination port",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of packets you wish to be sent:",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    std::istream::operator>>((istream *)&std::cin,&iStack_1095c);
    RStack_10918.protocol = IPv4UDPProto;
    RStack_10918._vptr_RTPTransmissionParams =
         (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013b038;
    uStack_108f0 = 0;
    RStack_10918._12_2_ = 5000;
    uStack_10908 = 0;
    uStack_108e8 = 1;
    uStack_108e4 = 0x800000008000;
    uStack_108dc = 0x800000008000;
    uStack_108c0 = 0;
    uStack_108d4 = 0;
    uStack_108cf = 0;
    uStack_108cc = 0;
    pppppuStack_10900 = &pppppuStack_10900;
    pppppuStack_108f8 = &pppppuStack_10900;
    jrtplib::RTPSessionParams::RTPSessionParams(&RStack_10890);
    RStack_10890.owntsunit = 0.1;
    RStack_10890.acceptown = true;
    iVar5 = jrtplib::RTPSession::Create(&RStack_107e8,&RStack_10890,&RStack_10918,IPv4UDPProto);
    checkerror(iVar5);
    RStack_108a8._12_4_ =
         iVar4 >> 0x18 | (iVar4 & 0xff0000) >> 8 | (iVar4 & 0xff00) << 8 | iVar4 << 0x18;
    RStack_108a8.addresstype = IPv4Address;
    RStack_108a8._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013bce0;
    sStack_10896 = sStack_10960 + 1;
    iVar5 = jrtplib::RTPSession::AddDestination(&RStack_107e8,&RStack_108a8);
    checkerror(iVar5);
    if (0 < iStack_1095c) {
      uVar7 = 1;
      do {
        iVar6 = (int)uVar7;
        printf("\nSending packet %d/%d\n",uVar7);
        iVar5 = jrtplib::RTPSession::SendPacket(&RStack_107e8,"1234567890",10,'\0',false,10);
        checkerror(iVar5);
        jrtplib::RTPSession::BeginDataAccess(&RStack_107e8);
        bVar3 = jrtplib::RTPSession::GotoFirstSourceWithData(&RStack_107e8);
        while (bVar3 != false) {
          while (p = jrtplib::RTPSession::GetNextPacket(&RStack_107e8), p != (RTPPacket *)0x0) {
            puts("Got packet !");
            jrtplib::RTPSession::DeletePacket(&RStack_107e8,p);
          }
          bVar3 = jrtplib::RTPSession::GotoNextSourceWithData(&RStack_107e8);
        }
        jrtplib::RTPSession::EndDataAccess(&RStack_107e8);
        iVar5 = jrtplib::RTPSession::Poll(&RStack_107e8);
        checkerror(iVar5);
        tStack_10938.tv_sec = 1;
        tStack_10938.tv_nsec = 0;
        nanosleep(&tStack_10938,&tStack_108b8);
        uVar7 = (ulong)(iVar6 + 1);
      } while (iVar6 < iStack_1095c);
    }
    tStack_10938.tv_sec = 0x4024000000000000;
    jrtplib::RTPSession::BYEDestroy(&RStack_107e8,(RTPTime *)&tStack_10938,(void *)0x0,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)RStack_10890.cname._M_dataplus._M_p != &RStack_10890.cname.field_2) {
      operator_delete(RStack_10890.cname._M_dataplus._M_p,
                      RStack_10890.cname.field_2._M_allocated_capacity + 1);
    }
    RStack_10918._vptr_RTPTransmissionParams =
         (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013b038;
    ppppppuVar2 = (undefined8 ******)pppppuStack_10900;
    while (ppppppuVar2 != &pppppuStack_10900) {
      ppppppuVar1 = (undefined8 ******)*ppppppuVar2;
      operator_delete(ppppppuVar2,0x18);
      ppppppuVar2 = ppppppuVar1;
    }
    iVar5 = 0;
  }
  if (pcStack_10958 != &cStack_10948) {
    operator_delete(pcStack_10958,CONCAT71(uStack_10947,cStack_10948) + 1);
  }
  jrtplib::RTPSession::~RTPSession(&RStack_107e8);
  MyMemoryManager::~MyMemoryManager(&MStack_10928);
  return iVar5;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyMemoryManager mgr;
	RTPSession sess(0, &mgr);
	uint16_t portbase,destport;
	uint32_t destip;
	std::string ipstr;
	int status,i,num;

        // First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << "Enter the destination IP address" << std::endl;
	std::cin >> ipstr;
	destip = inet_addr(ipstr.c_str());
	if (destip == INADDR_NONE)
	{
		std::cerr << "Bad IP address specified" << std::endl;
		return -1;
	}
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	std::cout << "Enter the destination port" << std::endl;
	std::cin >> destport;
	
	std::cout << std::endl;
	std::cout << "Number of packets you wish to be sent:" << std::endl;
	std::cin >> num;
	
	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	RTPIPv4Address addr(destip,destport);
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);
		
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}